

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# term.hh
# Opt level: O3

void __thiscall OB::Term::ostream::streambuf::~streambuf(streambuf *this)

{
  ~streambuf(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

~streambuf()
    {
      flush();
    }